

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O2

string * __thiscall
gl4cts::GPUShaderFP64Test7::getGeometryShaderBody_abi_cxx11_
          (string *__return_storage_ptr__,GPUShaderFP64Test7 *this,_variables *variables)

{
  uint uVar1;
  _variable_type type;
  pointer p_Var2;
  pointer p_Var3;
  pointer p_Var4;
  uint uVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  uint uVar10;
  _variable_type type_00;
  uint uVar11;
  char *pcVar12;
  uint uVar13;
  bool bVar14;
  string variable_type_string;
  string local_380 [32];
  string local_360 [32];
  stringstream array_index_sstream;
  ostream local_330;
  stringstream result_sstream;
  ostream local_1a8;
  
  std::__cxx11::stringstream::stringstream((stringstream *)&result_sstream);
  pcVar12 = 
  "#version 400\n\nlayout(triangles)                      in;\nlayout(triangle_strip, max_vertices=4) out;\n\nin TE_DATA\n{\n"
  ;
  poVar6 = std::operator<<(&local_1a8,
                           "#version 400\n\nlayout(triangles)                      in;\nlayout(triangle_strip, max_vertices=4) out;\n\nin TE_DATA\n{\n"
                          );
  getVariableDeclarations_abi_cxx11_
            ((string *)&array_index_sstream,(GPUShaderFP64Test7 *)pcVar12,"te",variables,
             glcts::fixed_sample_locations_values + 1);
  poVar6 = std::operator<<(poVar6,(string *)&array_index_sstream);
  pcVar12 = "} in_data[];\n\nout GS_DATA\n{\n";
  poVar6 = std::operator<<(poVar6,"} in_data[];\n\nout GS_DATA\n{\n");
  getVariableDeclarations_abi_cxx11_
            (&variable_type_string,(GPUShaderFP64Test7 *)pcVar12,"gs",variables,"flat");
  poVar6 = std::operator<<(poVar6,(string *)&variable_type_string);
  std::operator<<(poVar6,"};\n\nvoid main()\n{\n");
  std::__cxx11::string::~string((string *)&variable_type_string);
  std::__cxx11::string::~string((string *)&array_index_sstream);
  p_Var2 = (variables->
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  p_Var3 = (variables->
           super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
           )._M_impl.super__Vector_impl_data._M_start;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    lVar7 = lVar9 * 0x10;
    for (uVar10 = 0; uVar8 = (ulong)uVar10, uVar8 < (ulong)(((long)p_Var2 - (long)p_Var3) / 0xc);
        uVar10 = uVar10 + 1) {
      p_Var4 = (variables->
               super__Vector_base<gl4cts::GPUShaderFP64Test7::_variable,_std::allocator<gl4cts::GPUShaderFP64Test7::_variable>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar1 = p_Var4[uVar8].array_size;
      type = p_Var4[uVar8].type;
      uVar5 = Utils::getNumberOfComponentsForVariableType(type);
      Utils::getVariableTypeString_abi_cxx11_(&variable_type_string,(Utils *)(ulong)type,type_00);
      for (uVar8 = 0; uVar8 != uVar1; uVar8 = uVar8 + 1) {
        std::__cxx11::stringstream::stringstream((stringstream *)&array_index_sstream);
        if (1 < uVar1) {
          poVar6 = std::operator<<(&local_330,"[");
          poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
          std::operator<<(poVar6,"]");
        }
        poVar6 = std::operator<<(&local_1a8,"gs_variable");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__cxx11::stringbuf::str();
        poVar6 = std::operator<<(poVar6,local_360);
        poVar6 = std::operator<<(poVar6," = in_data[0].te_variable");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        std::__cxx11::stringbuf::str();
        poVar6 = std::operator<<(poVar6,local_380);
        poVar6 = std::operator<<(poVar6," + ");
        poVar6 = std::operator<<(poVar6,(string *)&variable_type_string);
        std::operator<<(poVar6,"(");
        std::__cxx11::string::~string(local_380);
        std::__cxx11::string::~string(local_360);
        uVar13 = uVar5;
        while (uVar11 = uVar13 - 1, uVar13 != 0) {
          std::ostream::_M_insert<unsigned_long>((ulong)&local_1a8);
          bVar14 = uVar13 != 1;
          uVar13 = uVar11;
          if (bVar14) {
            std::operator<<(&local_1a8,", ");
          }
        }
        std::operator<<(&local_1a8,");\n");
        std::__cxx11::stringstream::~stringstream((stringstream *)&array_index_sstream);
      }
      std::__cxx11::string::~string((string *)&variable_type_string);
    }
    poVar6 = std::operator<<(&local_1a8,"gl_Position = vec4(");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(float *)(&DAT_0168dfc0 + lVar7));
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(float *)(&DAT_0168dfc4 + lVar7));
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(float *)(&DAT_0168dfc8 + lVar7));
    poVar6 = std::operator<<(poVar6,", ");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(float *)(&DAT_0168dfcc + lVar7));
    std::operator<<(poVar6,");\nEmitVertex();\n");
  }
  std::operator<<(&local_1a8,"EndPrimitive();\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&result_sstream);
  return __return_storage_ptr__;
}

Assistant:

std::string GPUShaderFP64Test7::getGeometryShaderBody(const _variables& variables)
{
	std::stringstream result_sstream;

	/* Form the pre-amble */
	result_sstream << "#version 400\n"
					  "\n"
					  "layout(triangles)                      in;\n"
					  "layout(triangle_strip, max_vertices=4) out;\n"
					  "\n"

					  /* Add the input block */
					  "in TE_DATA\n"
					  "{\n"
				   << getVariableDeclarations("te", variables) << "} in_data[];\n"
																  "\n"

																  /* Add the output block */
																  "out GS_DATA\n"
																  "{\n"
				   << getVariableDeclarations("gs", variables, "flat") << "};\n"
																		  "\n"

																		  /* Declare main() function */
																		  "void main()\n"
																		  "{\n";

	/* Take input variables, add a predefined value and forward them to output variables */
	const float quad_vertices[] = { -1.0f, -1.0f, 0.0f, 1.0f, -1.0f, 1.0f, 0.0f, 1.0f,
									1.0f,  -1.0f, 0.0f, 1.0f, 1.0f,  1.0f, 0.0f, 1.0f };
	const unsigned int n_quad_vertices =
		sizeof(quad_vertices) / sizeof(quad_vertices[0]) / 4 /* components per vertex */;
	const size_t n_variables = variables.size();

	for (unsigned int n_quad_vertex = 0; n_quad_vertex < n_quad_vertices; ++n_quad_vertex)
	{
		unsigned int counter			 = 4;
		const float* current_quad_vertex = quad_vertices + n_quad_vertex * 4 /* components per vertex */;

		for (unsigned int n_variable = 0; n_variable < n_variables; ++n_variable)
		{
			unsigned int		  variable_array_size = variables[n_variable].array_size;
			Utils::_variable_type variable_type		  = variables[n_variable].type;
			unsigned int n_variable_type_components   = Utils::getNumberOfComponentsForVariableType(variable_type);
			std::string  variable_type_string		  = Utils::getVariableTypeString(variable_type);

			for (unsigned int index = 0; index < variable_array_size; ++index)
			{
				std::stringstream array_index_sstream;

				if (variable_array_size > 1)
				{
					array_index_sstream << "[" << index << "]";
				}

				result_sstream << "gs_variable" << n_variable << array_index_sstream.str()
							   << " = in_data[0].te_variable" << n_variable << array_index_sstream.str() << " + "
							   << variable_type_string << "(";

				for (unsigned int n_component = 0; n_component < n_variable_type_components; ++n_component)
				{
					result_sstream << (counter++);

					if (n_component != (n_variable_type_components - 1))
					{
						result_sstream << ", ";
					}
				} /* for (all components) */

				result_sstream << ");\n";
			} /* for (all array indices) */
		}	 /* for (all variable types) */

		result_sstream << "gl_Position = vec4(" << current_quad_vertex[0] << ", " << current_quad_vertex[1] << ", "
					   << current_quad_vertex[2] << ", " << current_quad_vertex[3] << ");\n"
																					  "EmitVertex();\n";
	} /* for (all emitted quad vertices) */

	result_sstream << "EndPrimitive();\n"
					  "}\n";

	/* All done */
	return result_sstream.str();
}